

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int nghttp2_submit_response
              (nghttp2_session *session,int32_t stream_id,nghttp2_nv *nva,size_t nvlen,
              nghttp2_data_provider *data_prd)

{
  uint8_t flags_00;
  uint8_t flags;
  nghttp2_data_provider *data_prd_local;
  size_t nvlen_local;
  nghttp2_nv *nva_local;
  int32_t stream_id_local;
  nghttp2_session *session_local;
  
  if (stream_id < 1) {
    session_local._4_4_ = -0x1f5;
  }
  else if (session->server == '\0') {
    session_local._4_4_ = -0x1f9;
  }
  else {
    flags_00 = set_response_flags(data_prd);
    session_local._4_4_ =
         submit_headers_shared_nva
                   (session,flags_00,stream_id,(nghttp2_priority_spec *)0x0,nva,nvlen,data_prd,
                    (void *)0x0);
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_submit_response(nghttp2_session *session, int32_t stream_id,
                            const nghttp2_nv *nva, size_t nvlen,
                            const nghttp2_data_provider *data_prd) {
  uint8_t flags;

  if (stream_id <= 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (!session->server) {
    return NGHTTP2_ERR_PROTO;
  }

  flags = set_response_flags(data_prd);
  return submit_headers_shared_nva(session, flags, stream_id, NULL, nva, nvlen,
                                   data_prd, NULL);
}